

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

void __thiscall MeCab::FeatureIndex::calcCost(FeatureIndex *this,LearnerPath *path)

{
  bool bVar1;
  LearnerPath *in_RSI;
  long in_RDI;
  int *f;
  int *local_18;
  
  bVar1 = is_empty(in_RSI);
  if (!bVar1) {
    in_RSI->cost = in_RSI->rnode->wcost;
    for (local_18 = in_RSI->fvector; *local_18 != -1; local_18 = local_18 + 1) {
      in_RSI->cost = *(double *)(*(long *)(in_RDI + 0x168) + (long)*local_18 * 8) + in_RSI->cost;
    }
  }
  return;
}

Assistant:

void FeatureIndex::calcCost(LearnerPath *path) {
  if (is_empty(path)) return;
  path->cost = path->rnode->wcost;
  for (const int *f = path->fvector; *f != -1; ++f) {
    path->cost += alpha_[*f];
  }
}